

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ClockingDirectionSyntax::getChild(ClockingDirectionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  undefined8 in_RDX;
  Info *in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  
  switch(in_RDX) {
  case 0:
    token.info = in_RSI;
    token._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token);
    break;
  case 1:
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffa8);
    break;
  case 2:
    token_00.info = in_RSI;
    token_00._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_00);
    break;
  case 3:
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffa8);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax ClockingDirectionSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return input;
        case 1: return inputSkew;
        case 2: return output;
        case 3: return outputSkew;
        default: return nullptr;
    }
}